

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.h
# Opt level: O3

void install_visible_enum_symbol(void *context,fb_symbol_t *sym)

{
  undefined2 uVar1;
  fb_token_t *pfVar2;
  undefined8 *puVar3;
  void *pvVar4;
  install_enum_context_t *p;
  
  uVar1 = sym->kind;
  if (((ushort)(uVar1 - 3) < 2) &&
     (pvVar4 = ptr_set_find_item((ptr_set_t *)(*(long *)((long)context + 8) + 0x128),sym[1].ident),
     pvVar4 != (void *)0x0)) {
    pfVar2 = sym->ident;
    puVar3 = *(undefined8 **)((long)context + 0x10);
    *puVar3 = pfVar2->text;
    *(int *)(puVar3 + 1) = (int)pfVar2->len;
    puVar3[2] = sym;
    *(undefined8 **)((long)context + 0x10) = puVar3 + 4;
  }
  return;
}

Assistant:

static inline fb_compound_type_t *get_enum_if_visible(fb_schema_t *schema, fb_symbol_t *sym)
{
    fb_compound_type_t *ct = 0;

    switch (sym->kind) {
    case fb_is_union:
        /* Fall through. */
    case fb_is_enum:
        ct = (fb_compound_type_t *)sym;
        if (!ptr_set_exists(&schema->visible_schema, ct->schema)) {
            ct = 0;
        }
        break;
    default:
        break;
    }
    return ct;
}